

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

uint64_t ptls_decode_quicint(uint8_t **src,uint8_t *end)

{
  byte bVar1;
  byte *pbVar2;
  uint local_34;
  uint8_t **ppuStack_30;
  uint bytes_left;
  uint64_t v;
  uint8_t b;
  uint8_t *end_local;
  uint8_t **src_local;
  
  if (*src == end) {
    src_local = (uint8_t **)0xffffffffffffffff;
  }
  else {
    pbVar2 = *src;
    *src = pbVar2 + 1;
    bVar1 = *pbVar2;
    if (bVar1 < 0x40) {
      src_local = (uint8_t **)(ulong)bVar1;
    }
    else {
      ppuStack_30 = (uint8_t **)(long)(int)(bVar1 & 0x3f);
      local_34 = (1 << (sbyte)((int)(uint)bVar1 >> 6)) - 1;
      if ((ulong)((long)end - (long)*src) < (ulong)local_34) {
        src_local = (uint8_t **)0xffffffffffffffff;
      }
      else {
        do {
          pbVar2 = *src;
          *src = pbVar2 + 1;
          ppuStack_30 = (uint8_t **)((long)ppuStack_30 << 8 | (ulong)*pbVar2);
          local_34 = local_34 - 1;
          src_local = ppuStack_30;
        } while (local_34 != 0);
      }
    }
  }
  return (uint64_t)src_local;
}

Assistant:

uint64_t ptls_decode_quicint(const uint8_t **src, const uint8_t *end)
{
    if (PTLS_UNLIKELY(*src == end))
        return UINT64_MAX;

    uint8_t b = *(*src)++;

    if (PTLS_LIKELY(b <= 0x3f))
        return b;

    uint64_t v = b & 0x3f;
    unsigned bytes_left = (1 << (b >> 6)) - 1;
    if (PTLS_UNLIKELY((size_t)(end - *src) < bytes_left))
        return UINT64_MAX;
    do {
        v = (v << 8) | *(*src)++;
    } while (--bytes_left != 0);
    return v;
}